

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_xref.c
# Opt level: O0

int OBJ_find_sigid_algs(int signid,int *pdig_nid,int *ppkey_nid)

{
  int idx;
  nid_triple *rv;
  nid_triple tmp;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  nid_triple *sk;
  int local_4;
  
  sk = (nid_triple *)0x0;
  if (sig_app != (stack_st_nid_triple *)0x0) {
    in_stack_ffffffffffffffcc =
         sk_nid_triple_find((stack_st_nid_triple *)0x0,
                            (nid_triple *)
                            CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    sk = sk_nid_triple_value((stack_st_nid_triple *)sk,in_stack_ffffffffffffffcc);
  }
  if (sk == (nid_triple *)0x0) {
    sk = OBJ_bsearch_sig((nid_triple *)0x0,
                         (nid_triple *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         ,0);
  }
  if (sk == (nid_triple *)0x0) {
    local_4 = 0;
  }
  else {
    if (pdig_nid != (int *)0x0) {
      *pdig_nid = sk->hash_id;
    }
    if (ppkey_nid != (int *)0x0) {
      *ppkey_nid = sk->pkey_id;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int OBJ_find_sigid_algs(int signid, int *pdig_nid, int *ppkey_nid)
{
    nid_triple tmp;
    const nid_triple *rv = NULL;
    tmp.sign_id = signid;

    if (sig_app != NULL) {
        int idx = sk_nid_triple_find(sig_app, &tmp);
        rv = sk_nid_triple_value(sig_app, idx);
    }
#ifndef OBJ_XREF_TEST2
    if (rv == NULL) {
        rv = OBJ_bsearch_sig(&tmp, sigoid_srt, OSSL_NELEM(sigoid_srt));
    }
#endif
    if (rv == NULL)
        return 0;
    if (pdig_nid)
        *pdig_nid = rv->hash_id;
    if (ppkey_nid)
        *ppkey_nid = rv->pkey_id;
    return 1;
}